

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_sync_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::subscription_sync_test::
SubscriptionSyncTest_test_encode_with_unchanged_edition_with_controls_Test::
SubscriptionSyncTest_test_encode_with_unchanged_edition_with_controls_Test
          (SubscriptionSyncTest_test_encode_with_unchanged_edition_with_controls_Test *this)

{
  SubscriptionSyncTest_test_encode_with_unchanged_edition_with_controls_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__SubscriptionSyncTest_test_encode_with_unchanged_edition_with_controls_Test_003d9dc8;
  return;
}

Assistant:

TEST(SubscriptionSyncTest, test_encode_with_unchanged_edition_with_controls)
{
    SubscriptionSync subscription_sync = SubscriptionSync(EDITION, subject_list);
    subscription_sync.AddControl(0, ControlOperationEnum::REFRESH);
    subscription_sync.AddControl(1, ControlOperationEnum::TOGGLE);
    subscription_sync.SetChangedEdition(false);

    ByteBuffer buffer = subscription_sync.Encode(PixieVersion::CURRENT_VERSION);
    ASSERT_EQ("S\006\173\002\002\000R\001T"s, BufferUtil::BufferAsString(buffer));
}